

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# composition.cc
# Opt level: O1

bool tinyusdz::anon_unknown_160::CompositeVariantRec
               (uint32_t depth,PrimSpec *primspec,string *warn,string *err)

{
  PrimSpec *pPVar1;
  bool bVar2;
  ostream *poVar3;
  PrimSpec *primspec_00;
  bool bVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  variant_selection;
  PrimSpec dst;
  undefined1 *local_5c8;
  _Rb_tree_node_base local_5c0;
  size_t local_5a0;
  undefined1 local_598 [1384];
  
  if (depth < 0x100001) {
    primspec_00 = (primspec->_children).
                  super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>.
                  _M_impl.super__Vector_impl_data._M_start;
    pPVar1 = (primspec->_children).
             super__Vector_base<tinyusdz::PrimSpec,_std::allocator<tinyusdz::PrimSpec>_>._M_impl.
             super__Vector_impl_data._M_finish;
    bVar4 = primspec_00 == pPVar1;
    if (!bVar4) {
      bVar2 = CompositeVariantRec(depth + 1,primspec_00,warn,err);
      if (bVar2) {
        do {
          primspec_00 = primspec_00 + 1;
          bVar4 = primspec_00 == pPVar1;
          if (bVar4) goto LAB_001ae2d8;
          bVar2 = CompositeVariantRec(depth + 1,primspec_00,warn,err);
        } while (bVar2);
      }
      if (!bVar4) goto LAB_001ae270;
    }
LAB_001ae2d8:
    PrimSpec::PrimSpec((PrimSpec *)local_598);
    local_5c0._M_left = &local_5c0;
    local_5c0._M_color = _S_red;
    local_5c0._M_parent = (_Base_ptr)0x0;
    local_5a0 = 0;
    local_5c0._M_right = local_5c0._M_left;
    bVar4 = VariantSelectPrimSpec
                      ((PrimSpec *)local_598,primspec,
                       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)&local_5c8,warn,err);
    if ((PrimSpec *)local_598 != primspec && bVar4) {
      PrimSpec::MoveFrom(primspec,(PrimSpec *)local_598);
    }
    ::std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)&local_5c8,(_Link_type)local_5c0._M_parent);
    PrimSpec::~PrimSpec((PrimSpec *)local_598);
  }
  else {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_598);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_598,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_598,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/composition.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_598,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_598,"CompositeVariantRec",0x13);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_598,"():",3);
    poVar3 = (ostream *)::std::ostream::operator<<((ostringstream *)local_598,0x3a1);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_598,"Too deep.",9);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_598,"\n",1);
    if (err != (string *)0x0) {
      ::std::__cxx11::stringbuf::str();
      ::std::__cxx11::string::_M_append((char *)err,(ulong)local_5c8);
      if ((_Base_ptr *)local_5c8 != &local_5c0._M_parent) {
        operator_delete(local_5c8,(ulong)((long)&(local_5c0._M_parent)->_M_color + 1));
      }
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_598);
    ::std::ios_base::~ios_base((ios_base *)(local_598 + 0x70));
LAB_001ae270:
    bVar4 = false;
  }
  return bVar4;
}

Assistant:

bool CompositeVariantRec(uint32_t depth, PrimSpec &primspec /* [inout] */,
                         std::string *warn, std::string *err) {
  if (depth > (1024 * 1024)) {
    PUSH_ERROR_AND_RETURN("Too deep.");
  }

  // Traverse children first.
  for (auto &child : primspec.children()) {
    if (!CompositeVariantRec(depth + 1, child, warn, err)) {
      return false;
    }
  }

  PrimSpec dst;
  std::map<std::string, std::string>
      variant_selection;  // empty = use variant settings in PrimSpec.

  if (!VariantSelectPrimSpec(dst, primspec, variant_selection, warn, err)) {
    return false;
  }

  primspec = std::move(dst);

  return true;
}